

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

int __thiscall
capnp::_::anon_unknown_0::TestVat::connect(TestVat *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Entry **ppEVar1;
  uint uVar2;
  TestNetwork *pTVar3;
  Entry *pEVar4;
  HashBucket *pHVar5;
  TestVat *params_1;
  ConnectionImpl *pCVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  undefined4 in_register_00000034;
  TestVat *pTVar10;
  bool *params_3;
  char *in_R9;
  uint uVar11;
  ulong uVar12;
  byte *in_stack_00000018;
  StructDataBitCount in_stack_00000028;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> remote;
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
  *in_stack_ffffffffffffff48;
  bool local_a9;
  Fault local_a8;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> local_a0;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_90;
  char *local_80;
  undefined8 local_78;
  undefined1 local_70;
  TestVat *local_68;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> local_60;
  StringPtr *local_50;
  TestVat *local_48;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_40;
  
  pTVar10 = (TestVat *)CONCAT44(in_register_00000034,__fd);
  local_90 = (Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
              )capnproto_test::capnp::test::TestSturdyRefHostId::Reader::getHost
                         ((Reader *)&stack0x00000008);
  bVar7 = kj::ArrayPtr<const_char>::operator==
                    ((ArrayPtr<const_char> *)&local_90,&(pTVar10->self).content);
  if (bVar7) {
    (this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase = (_func_int **)0x0;
    this->network = (TestNetwork *)0x0;
LAB_001d95d4:
    return (int)this;
  }
  pTVar3 = pTVar10->network;
  local_68 = this;
  local_50 = &pTVar10->self;
  local_48 = pTVar10;
  local_90 = (Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
              )capnproto_test::capnp::test::TestSturdyRefHostId::Reader::getHost
                         ((Reader *)&stack0x00000008);
  if ((pTVar3->map).table.indexes.buckets.size_ != 0) {
    pEVar4 = (pTVar3->map).table.rows.builder.ptr;
    uVar8 = kj::hashCode<kj::StringPtr&>((StringPtr *)&local_90);
    sVar9 = (pTVar3->map).table.indexes.buckets.size_;
    uVar11 = (int)sVar9 - 1U & uVar8;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pHVar5 = (pTVar3->map).table.indexes.buckets.ptr;
      uVar2 = pHVar5[uVar12].value;
      if (uVar2 == 0) break;
      if ((uVar2 != 1) && (pHVar5[uVar12].hash == uVar8)) {
        bVar7 = kj::ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)(pEVar4 + (uVar2 - 2)),
                           (ArrayPtr<const_char> *)&local_90);
        pTVar10 = local_48;
        if (bVar7) {
          pEVar4 = (pTVar3->map).table.rows.builder.ptr;
          if ((pEVar4 != (Entry *)0x0) &&
             (params_1 = pEVar4[pHVar5[uVar12].value - 2].value.ptr, params_1 != (TestVat *)0x0)) {
            if (in_stack_00000028 == 0) {
              local_a9 = false;
LAB_001d940e:
              local_a0.disposer = (Disposer *)params_1;
              kj::
              HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              ::find<capnp::_::(anonymous_namespace)::TestVat*>
                        ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                          *)&local_90,(TestVat **)&local_48->connections);
              this = local_68;
              if (local_90.disposer == (Disposer *)0x0) goto LAB_001d946b;
              pTVar3 = (TestNetwork *)(local_90.disposer)->_vptr_Disposer;
              ppEVar1 = &(pTVar3->dumper).schemas.table.rows.builder.endPtr;
              *(int *)ppEVar1 = *(int *)ppEVar1 + 1;
              local_a0.disposer = (Disposer *)&(pTVar3->dumper).schemas.table.rows.builder.pos;
              local_a0.ptr = (ConnectionImpl *)0x0;
              (local_68->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
                   (_func_int **)local_a0.disposer;
              local_68->network = pTVar3;
              local_90.ptr = (Connection *)0x0;
              local_90.disposer = local_a0.disposer;
              kj::
              Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
              ::dispose(&local_90);
            }
            else {
              local_a9 = (bool)(*in_stack_00000018 & 1);
              if (local_a9 == false) goto LAB_001d940e;
LAB_001d946b:
              params_3 = &local_a9;
              kj::
              refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
                        ((kj *)&local_a0,pTVar10,params_1,local_50,params_3);
              kj::
              refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
                        ((kj *)&local_60,params_1,pTVar10,&params_1->self,params_3);
              this = local_68;
              pCVar6 = local_a0.ptr;
              local_70 = ((local_a0.ptr)->partner).ptr == (ConnectionImpl *)0x0;
              local_90.ptr = (Connection *)&kj::none;
              local_90.disposer = (Disposer *)&(local_a0.ptr)->partner;
              local_80 = " == ";
              local_78 = 5;
              if (!(bool)local_70) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
                          (&local_a8,(char *)0x12a,0x44fe3e,(Type)&local_90,params_3,in_R9,
                           in_stack_ffffffffffffff48);
                kj::_::Debug::Fault::fatal(&local_a8);
              }
              local_70 = ((local_60.ptr)->partner).ptr == (ConnectionImpl *)0x0;
              local_90.disposer = (Disposer *)&(local_60.ptr)->partner;
              local_90.ptr = (Connection *)&kj::none;
              local_80 = " == ";
              local_78 = 5;
              if (!(bool)local_70) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
                          (&local_a8,(char *)0x12b,0x44fe38,(Type)&local_90,params_3,in_R9,
                           in_stack_ffffffffffffff48);
                kj::_::Debug::Fault::fatal(&local_a8);
              }
              ((local_a0.ptr)->partner).ptr = local_60.ptr;
              sVar9 = ((local_60.ptr)->vat->self).content.size_;
              ((local_a0.ptr)->partnerName).content.ptr = ((local_60.ptr)->vat->self).content.ptr;
              ((local_a0.ptr)->partnerName).content.size_ = sVar9;
              ((local_60.ptr)->partner).ptr = local_a0.ptr;
              sVar9 = *(size_t *)(*(long *)&(local_a0.ptr)->vat + 0x18);
              ((local_60.ptr)->partnerName).content.ptr =
                   *(char **)(*(long *)&(local_a0.ptr)->vat + 0x10);
              ((local_60.ptr)->partnerName).content.size_ = sVar9;
              ((local_a0.ptr)->dumper).partner.ptr = &(local_60.ptr)->dumper;
              ((local_60.ptr)->dumper).partner.ptr = &(local_a0.ptr)->dumper;
              sVar9 = ((local_60.ptr)->dumper).name.content.size_;
              ((local_a0.ptr)->dumper).partnerName.content.ptr =
                   ((local_60.ptr)->dumper).name.content.ptr;
              ((local_a0.ptr)->dumper).partnerName.content.size_ = sVar9;
              sVar9 = ((local_a0.ptr)->dumper).name.content.size_;
              ((local_60.ptr)->dumper).partnerName.content.ptr =
                   (char *)((local_a0.ptr)->dumper).name.content.ptr;
              ((local_60.ptr)->dumper).partnerName.content.size_ = sVar9;
              local_40.disposer = local_60.disposer;
              local_40.ptr = &(local_60.ptr)->super_Connection;
              local_60.ptr = (ConnectionImpl *)0x0;
              kj::
              ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
              ::push(&params_1->acceptQueue,&local_40);
              kj::
              Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
              ::dispose(&local_40);
              local_a0.ptr = (ConnectionImpl *)0x0;
              (this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
                   (_func_int **)local_a0.disposer;
              this->network = (TestNetwork *)pCVar6;
              local_90.ptr = (Connection *)0x0;
              local_90.disposer = local_a0.disposer;
              kj::
              Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
              ::dispose(&local_90);
              kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::
              ~Own(&local_60);
            }
            kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::~Own
                      (&local_a0);
            goto LAB_001d95d4;
          }
          break;
        }
        sVar9 = (pTVar3->map).table.indexes.buckets.size_;
      }
      uVar11 = (uint)(uVar12 + 1);
      if (uVar12 + 1 == sVar9) {
        uVar11 = 0;
      }
    }
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,0x246,FAILED,"network.find(hostId.getHost()) != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&local_90);
}

Assistant:

kj::Maybe<kj::Own<Connection>> connect(test::TestSturdyRefHostId::Reader hostId) override {
    if (hostId.getHost() == self) {
      return kj::none;
    }

    TestVat& dst = KJ_REQUIRE_NONNULL(network.find(hostId.getHost()));

    bool unique = hostId.getUnique();
    if (!unique) {
      KJ_IF_SOME(conn, connections.find(&dst)) {
        // Return existing connection.
        return kj::Own<Connection>(kj::addRef(*conn));
      }
    }

    // Create new connection.
    auto local = kj::refcounted<ConnectionImpl>(*this, dst, self, unique);
    auto remote = kj::refcounted<ConnectionImpl>(dst, *this, dst.self, unique);
    local->attach(*remote);

    dst.acceptQueue.push(kj::mv(remote));
    return kj::Own<Connection>(kj::mv(local));
  }